

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_rand.c
# Opt level: O1

int randombytes_linux_getrandom(void *buf_,size_t size)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  size_t chunk_size;
  ulong uVar4;
  
  uVar4 = 0x100;
  do {
    if (size < uVar4) {
      uVar4 = size;
    }
    lVar1 = syscall(0x13e,buf_,uVar4 & 0xffffffff,0);
    iVar3 = (int)lVar1;
    if (iVar3 < 0) {
      piVar2 = __errno_location();
      do {
        iVar3 = (int)lVar1;
        if ((*piVar2 != 0xb) && (*piVar2 != 4)) break;
        lVar1 = syscall(0x13e,buf_,uVar4 & 0xffffffff,0);
        iVar3 = (int)lVar1;
      } while (iVar3 < 0);
    }
    if (iVar3 != (int)uVar4) {
      return -1;
    }
    buf_ = (void *)((long)buf_ + uVar4);
    size = size - uVar4;
    if (size == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int randombytes_linux_getrandom(void * const buf_, size_t size)
{
    unsigned char *buf = (unsigned char *) buf_;
    size_t         chunk_size = 256U;

    do {
        if (size < chunk_size) 
        {
            chunk_size = size;
            assert(chunk_size > (size_t) 0U);
        }
        if (_randombytes_linux_getrandom(buf, chunk_size) != 0) 
        {
            return -1;
        }
        size -= chunk_size;
        buf += chunk_size;
    } while (size > (size_t) 0U);

    return 0;
}